

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_keyword_is_write(NGP_TOKEN *ngp_tok)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  long lVar6;
  
  if (ngp_tok == (NGP_TOKEN *)0x0) {
    return 0x16a;
  }
  pcVar5 = ngp_tok->name;
  lVar6 = 0;
  do {
    iVar3 = strcmp(*(char **)((long)ngp_keyword_is_write::nmni + lVar6),pcVar5);
    if (iVar3 == 0) {
      return 0x170;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x50);
  __s = "NAXIS";
  lVar6 = 1;
  do {
    sVar4 = strlen(__s);
    if (0xfffffffa < (int)sVar4 - 6U) {
      iVar3 = strncmp(__s,pcVar5,sVar4 & 0xffffffff);
      if (iVar3 == 0) {
        if ((byte)(pcVar5[sVar4 & 0xffffffff] - 0x3aU) < 0xf7) {
          return 0;
        }
        iVar3 = (int)sVar4 + -1;
        pcVar5 = ngp_tok->name + (sVar4 & 0xffffffff) + 1;
        bVar2 = false;
        do {
          cVar1 = *pcVar5;
          if (bVar2) {
            bVar2 = true;
            if (cVar1 != ' ') {
              return 0;
            }
          }
          else {
            bVar2 = false;
            if ((9 < (byte)(cVar1 - 0x30U)) && (bVar2 = true, cVar1 != ' ')) {
              if (cVar1 != '\0') {
                return 0;
              }
              return 0x170;
            }
          }
          iVar3 = iVar3 + 1;
          pcVar5 = pcVar5 + 1;
          if (5 < iVar3) {
            return 0x170;
          }
        } while( true );
      }
    }
    __s = ngp_keyword_is_write::nm[lVar6];
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int	ngp_keyword_is_write(NGP_TOKEN *ngp_tok)
 { int i, j, l, spc;
                        /* indexed variables not to write */

   static char *nm[] = { "NAXIS", "TFORM", "TTYPE", NULL } ;

                        /* non indexed variables not allowed to write */
  
   static char *nmni[] = { "SIMPLE", "XTENSION", "BITPIX", "NAXIS", "PCOUNT",
                           "GCOUNT", "TFIELDS", "THEAP", "EXTEND", "EXTVER",
                           NULL } ;

   if (NULL == ngp_tok) return(NGP_NUL_PTR);

   for (j = 0; ; j++)           /* first check non indexed */
    { if (NULL == nmni[j]) break;
      if (0 == strcmp(nmni[j], ngp_tok->name)) return(NGP_BAD_ARG);
    } 

   for (j = 0; ; j++)           /* now check indexed */
    { if (NULL == nm[j]) return(NGP_OK);
      l = strlen(nm[j]);
      if ((l < 1) || (l > 5)) continue;
      if (0 == strncmp(nm[j], ngp_tok->name, l)) break;
    } 

   if ((ngp_tok->name[l] < '1') || (ngp_tok->name[l] > '9')) return(NGP_OK);
   spc = 0;
   for (i = l + 1; i < 8; i++)
    { if (spc) { if (' ' != ngp_tok->name[i]) return(NGP_OK); }
      else
       { if ((ngp_tok->name[i] >= '0') && (ngp_tok->name[i] <= '9')) continue;
         if (' ' == ngp_tok->name[i]) { spc = 1; continue; }
         if (0 == ngp_tok->name[i]) break;
         return(NGP_OK);
       }
    }
   return(NGP_BAD_ARG);
 }